

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O2

bool __thiscall
cmCTestCurl::HttpRequest(cmCTestCurl *this,string *url,string *fields,string *response)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  bool bVar3;
  CURLcode CVar4;
  ostream *poVar5;
  curl_slist *list;
  iterator __begin2;
  pointer pbVar6;
  string curlDebug;
  vector<char,_std::allocator<char>_> debugData;
  vector<char,_std::allocator<char>_> responseData;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  undefined1 local_198 [360];
  
  response->_M_string_length = 0;
  *(response->_M_dataplus)._M_p = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"HttpRequest\n");
  poVar5 = std::operator<<(poVar5,"url: ");
  poVar5 = std::operator<<(poVar5,(string *)url);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"fields ");
  poVar5 = std::operator<<(poVar5,(string *)fields);
  std::operator<<(poVar5,"\n");
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
               ,0xca,curlDebug._M_dataplus._M_p,this->Quiet);
  std::__cxx11::string::~string((string *)&curlDebug);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar3 = InitCurl(this);
  if (bVar3) {
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_POST,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_POSTFIELDS,(fields->_M_dataplus)._M_p);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_URL,(url->_M_dataplus)._M_p);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FOLLOWLOCATION,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEFUNCTION,
                     anon_unknown.dwarf_496683::curlWriteMemoryCallback);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGFUNCTION,
                     anon_unknown.dwarf_496683::curlDebugCallback);
    responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEDATA);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGDATA,&debugData);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FAILONERROR,1);
    pbVar6 = (this->HttpHeaders).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->HttpHeaders).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    list = (curl_slist *)0x0;
    if (pbVar6 != pbVar2) {
      for (; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"   Add HTTP Header: \"");
        poVar5 = std::operator<<(poVar5,(string *)pbVar6);
        poVar5 = std::operator<<(poVar5,"\"");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar1 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xe3,curlDebug._M_dataplus._M_p,this->Quiet);
        std::__cxx11::string::~string((string *)&curlDebug);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        list = curl_slist_append(list,(pbVar6->_M_dataplus)._M_p);
      }
    }
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,list);
    CVar4 = curl_easy_perform((Curl_easy *)this->Curl);
    curl_slist_free_all(list);
    if (responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      _cmCTestLog_msg = local_198;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)&cmCTestLog_msg);
      std::__cxx11::string::operator=((string *)response,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Curl response: [");
      poVar5 = std::operator<<(poVar5,(string *)response);
      std::operator<<(poVar5,"]\n");
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xef,curlDebug._M_dataplus._M_p,this->Quiet);
      std::__cxx11::string::~string((string *)&curlDebug);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    if (debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      curlDebug._M_dataplus._M_p = (pointer)&curlDebug.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)&curlDebug);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Curl debug: [");
      poVar5 = std::operator<<(poVar5,(string *)&curlDebug);
      std::operator<<(poVar5,"]\n");
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xf4,local_1c8[0],this->Quiet);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&curlDebug);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Curl res: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,CVar4);
    std::operator<<(poVar5,"\n");
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xf7,curlDebug._M_dataplus._M_p,this->Quiet);
    std::__cxx11::string::~string((string *)&curlDebug);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar3 = CVar4 == CURLE_OK;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&debugData.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&responseData.super__Vector_base<char,_std::allocator<char>_>);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"Initialization of curl failed\n");
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xcc,curlDebug._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&curlDebug);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmCTestCurl::HttpRequest(std::string const& url,
                              std::string const& fields, std::string& response)
{
  response.clear();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "HttpRequest\n"
                       << "url: " << url << "\n"
                       << "fields " << fields << "\n",
                     this->Quiet);
  if (!this->InitCurl()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Initialization of curl failed\n");
    return false;
  }
  curl_easy_setopt(this->Curl, CURLOPT_POST, 1);
  curl_easy_setopt(this->Curl, CURLOPT_POSTFIELDS, fields.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_URL, url.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_FOLLOWLOCATION, 1);
  // set response options
  ::curl_easy_setopt(this->Curl, CURLOPT_WRITEFUNCTION,
                     curlWriteMemoryCallback);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGFUNCTION, curlDebugCallback);
  std::vector<char> responseData;
  std::vector<char> debugData;
  ::curl_easy_setopt(this->Curl, CURLOPT_FILE, &responseData);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGDATA, &debugData);
  ::curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);

  // Add headers if any were specified.
  struct curl_slist* headers = nullptr;
  if (!this->HttpHeaders.empty()) {
    for (std::string const& h : this->HttpHeaders) {
      cmCTestOptionalLog(this->CTest, DEBUG,
                         "   Add HTTP Header: \"" << h << "\"" << std::endl,
                         this->Quiet);
      headers = ::curl_slist_append(headers, h.c_str());
    }
  }

  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, headers);
  CURLcode res = ::curl_easy_perform(this->Curl);
  ::curl_slist_free_all(headers);

  if (!responseData.empty()) {
    response = std::string(responseData.begin(), responseData.end());
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Curl response: [" << response << "]\n", this->Quiet);
  }
  if (!debugData.empty()) {
    std::string curlDebug = std::string(debugData.begin(), debugData.end());
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Curl debug: [" << curlDebug << "]\n", this->Quiet);
  }
  cmCTestOptionalLog(this->CTest, DEBUG, "Curl res: " << res << "\n",
                     this->Quiet);
  return (res == 0);
}